

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

int pair0_pipe_start(void *arg)

{
  pair0_sock *s_00;
  uint16_t uVar1;
  pair0_sock *s;
  pair0_pipe *p;
  void *arg_local;
  
  s_00 = *(pair0_sock **)((long)arg + 8);
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 0x10) {
    nni_mtx_lock(&s_00->mtx);
    if (s_00->p == (pair0_pipe *)0x0) {
      s_00->p = (pair0_pipe *)arg;
      s_00->rd_ready = false;
      nni_mtx_unlock(&s_00->mtx);
      pair0_send_sched(s_00);
      nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x1d8));
      arg_local._4_4_ = 0;
    }
    else {
      nni_mtx_unlock(&s_00->mtx);
      uVar1 = nni_pipe_peer(*arg);
      nng_log_warn("NNG-PAIR-BUSY","Peer pipe protocol %d is already paired, rejected.",(ulong)uVar1
                  );
      arg_local._4_4_ = 4;
    }
  }
  else {
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar1,0x10
                );
    arg_local._4_4_ = 0xd;
  }
  return arg_local._4_4_;
}

Assistant:

static int
pair0_pipe_start(void *arg)
{
	pair0_pipe *p = arg;
	pair0_sock *s = p->pair;

	if (nni_pipe_peer(p->pipe) != NNI_PROTO_PAIR_V0) {
		// Peer protocol mismatch.
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), NNI_PROTO_PAIR_V0);
		return (NNG_EPROTO);
	}

	nni_mtx_lock(&s->mtx);
	if (s->p != NULL) {
		nni_mtx_unlock(&s->mtx);
		nng_log_warn("NNG-PAIR-BUSY",
		    "Peer pipe protocol %d is already paired, rejected.",
		    nni_pipe_peer(p->pipe));
		return (NNG_EBUSY); // Already have a peer, denied.
	}
	s->p        = p;
	s->rd_ready = false;
	nni_mtx_unlock(&s->mtx);

	pair0_send_sched(s);

	// And the pipe read of course.
	nni_pipe_recv(p->pipe, &p->aio_recv);

	return (0);
}